

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall ImgfsFile::SectionEntry::~SectionEntry(SectionEntry *this)

{
  (this->super_DirEntry)._vptr_DirEntry = (_func_int **)&PTR__SectionEntry_00143250;
  std::__cxx11::string::~string((string *)&(this->_name)._name);
  return;
}

Assistant:

virtual ~SectionEntry() { }